

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

bool __thiscall Clasp::LoopFormula::otherIsSat(LoopFormula *this,Solver *s)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  byte bVar8;
  
  uVar1 = this->other_;
  uVar5 = *(uint *)&this->field_0x10 >> 0x1f;
  uVar2 = *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + (ulong)uVar1 * 4);
  puVar3 = (s->assign_).assign_.ebo_.buf;
  bVar6 = (byte)*(undefined4 *)((long)puVar3 + (ulong)(uVar2 & 0xfffffffc)) & 3;
  bVar8 = 2 - ((uVar2 & 2) == 0);
  bVar4 = bVar6 == bVar8 && uVar1 != uVar5;
  if ((uVar1 == uVar5) && (bVar6 == bVar8)) {
    lVar7 = (ulong)this->end_ << 2;
    do {
      bVar4 = (ulong)(*(uint *)&this->field_0x10 << 2) - 4 == lVar7;
      if (bVar4) {
        return bVar4;
      }
      uVar1 = *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + lVar7 + 4);
      lVar7 = lVar7 + 4;
    } while ((byte)(*(byte *)((long)puVar3 + (ulong)(uVar1 & 0xfffffffc)) & 3) ==
             (byte)(2U - ((uVar1 & 2) == 0)));
    *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + (ulong)uVar5 * 4) =
         uVar1 | *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + (ulong)uVar5 * 4) & 1;
  }
  return bVar4;
}

Assistant:

bool LoopFormula::otherIsSat(const Solver& s) {
	if (other_ != xPos_)          { return s.isTrue(lits_[other_]); }
	if (!s.isTrue(lits_[other_])) { return false; }
	for (Literal* it = xBegin(), *end = xEnd(); it != end; ++it) {
		if (!s.isTrue(*it)) {
			if (lits_[xPos_].flagged()){ (lits_[xPos_] = *it).flag(); }
			else                       { lits_[xPos_] = *it; }
			return false;
		}
	}
	return true;
}